

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcyclicityIndex.cpp
# Opt level: O0

void __thiscall
Indexing::AcyclicityIndex::CycleSearchIterator::CycleSearchIterator
          (CycleSearchIterator *this,Literal *queryLit,Clause *queryClause,AcyclicityIndex *aindex)

{
  undefined8 uVar1;
  pair<Kernel::Literal_*,_Kernel::Clause_*> key;
  TypedTermList t;
  bool bVar2;
  SortId SVar3;
  TermList TVar4;
  DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  **ppDVar5;
  CycleSearchTreeNode *pCVar6;
  long in_RCX;
  _func_int **in_RSI;
  Literal *in_RDI;
  IndexEntry *entry;
  TermList sort;
  DHMap<Kernel::TermList,_Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffee8;
  CycleSearchTreeNode *elem;
  TermList in_stack_fffffffffffffef0;
  Literal *in_stack_fffffffffffffef8;
  Stack<Lib::BacktrackData> *in_stack_ffffffffffffff00;
  Clause *pCVar7;
  DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_ffffffffffffff08;
  RobSubstitution *in_stack_ffffffffffffff10;
  uint substIndex;
  Clause *c;
  TermList TVar8;
  
  (in_RDI->super_Term)._vptr_Term = in_RSI;
  *(undefined8 *)&(in_RDI->super_Term)._functor = 0;
  (in_RDI->super_Term)._weight = 0;
  (in_RDI->super_Term)._kboWeight = 0;
  *(undefined8 *)&(in_RDI->super_Term)._maxRedLen = 0;
  c = (Clause *)&(in_RDI->super_Term).field_9;
  Lib::Stack<Indexing::AcyclicityIndex::CycleSearchTreeNode_*>::Stack
            ((Stack<Indexing::AcyclicityIndex::CycleSearchTreeNode_*> *)in_stack_ffffffffffffff00,
             (size_t)in_stack_fffffffffffffef8);
  TVar8._content = (uint64_t)&in_RDI[1].super_Term._weight;
  SVar3._content = (uint64_t)Kernel::RobSubstitution::operator_new(0x2f0a44);
  Kernel::RobSubstitution::RobSubstitution(in_stack_ffffffffffffff10);
  *(uint64_t *)TVar8._content = SVar3._content;
  pCVar6 = (CycleSearchTreeNode *)&in_RDI[1].super_Term._maxRedLen;
  Lib::Stack<Lib::BacktrackData>::Stack(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8)
  ;
  in_RDI[2].super_Term._functor = 0;
  *(undefined4 *)&in_RDI[2].super_Term.field_0xc = 0;
  bVar2 = Kernel::Literal::isEquality((Literal *)0x2f0aa9);
  if (bVar2) {
    TVar4 = Kernel::SortHelper::getEqualityArgumentSort((Literal *)in_stack_ffffffffffffff08);
    substIndex = (uint)(TVar4._content >> 0x20);
    Lib::
    DHMap<Kernel::TermList,_Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::find((DHMap<Kernel::TermList,_Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)in_stack_ffffffffffffff08,(TermList *)in_stack_ffffffffffffff00);
    bVar2 = Lib::Option::operator_cast_to_bool
                      ((Option<Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*&>
                        *)0x2f0b03);
    if (bVar2) {
      ppDVar5 = Lib::
                DHMap<Kernel::TermList,_Lib::DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::get(in_stack_fffffffffffffee8,in_stack_fffffffffffffef0);
      *(DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
        **)&(in_RDI->super_Term)._functor = *ppDVar5;
      uVar1 = *(undefined8 *)(in_RCX + 0x50);
      (in_RDI->super_Term)._weight = (int)uVar1;
      (in_RDI->super_Term)._kboWeight = (int)((ulong)uVar1 >> 0x20);
      std::make_pair<Kernel::Literal*&,Kernel::Clause*&>
                ((Literal **)in_stack_fffffffffffffef0._content,(Clause **)in_stack_fffffffffffffee8
                );
      Lib::
      DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::find(in_stack_ffffffffffffff08,
             (pair<Kernel::Literal_*,_Kernel::Clause_*> *)in_stack_ffffffffffffff00);
      bVar2 = Lib::Option::operator_cast_to_bool
                        ((Option<Indexing::AcyclicityIndex::IndexEntry_*&> *)0x2f0bd4);
      if (bVar2) {
        pCVar7 = *(Clause **)&(in_RDI->super_Term)._functor;
        std::make_pair<Kernel::Literal*&,Kernel::Clause*&>
                  ((Literal **)in_stack_fffffffffffffef0._content,
                   (Clause **)in_stack_fffffffffffffee8);
        key.second = pCVar7;
        key.first = in_stack_fffffffffffffef8;
        Lib::
        DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
        ::get((DHMap<std::pair<Kernel::Literal_*,_Kernel::Clause_*>,_Indexing::AcyclicityIndex::IndexEntry_*,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)in_stack_fffffffffffffef0._content,key);
        elem = (CycleSearchTreeNode *)&(in_RDI->super_Term).field_9;
        in_RDI[2].super_Term._functor = in_RDI[2].super_Term._functor + 1;
        t._sort._content = SVar3._content;
        t.super_TermList._content = TVar8._content;
        pCVar6 = CycleSearchTreeNode::unificationNode(t,in_RDI,c,pCVar6,substIndex);
        Lib::Stack<Indexing::AcyclicityIndex::CycleSearchTreeNode_*>::push
                  ((Stack<Indexing::AcyclicityIndex::CycleSearchTreeNode_*> *)pCVar6,elem);
      }
    }
  }
  return;
}

Assistant:

CycleSearchIterator(Literal *queryLit,
                        Clause *queryClause,
                        AcyclicityIndex& aindex)
      :
      _queryLit(queryLit),
      _index(nullptr),
      _tis(nullptr),
      _nextResult(nullptr),
      _stack(0),
      _subst(new RobSubstitution()),
      _substChanges(0),
      _nextAvailableIndex(0),
      _currentDepth(0)
    {
      if (queryLit->isEquality()) {
        TermList sort = SortHelper::getEqualityArgumentSort(queryLit);

        if (aindex._sIndexes.find(sort)) {
          _index = aindex._sIndexes.get(sort);
          _tis = aindex._tis;
          if (_index->find(make_pair(queryLit, queryClause))) {
            IndexEntry *entry = _index->get(make_pair(queryLit, queryClause));
            _stack.push(CycleSearchTreeNode::unificationNode(entry->t,
                                                             queryLit,
                                                             queryClause,
                                                             nullptr,
                                                             _nextAvailableIndex++));
          }
        }
      }
      ASS_EQ(_currentDepth, _substChanges.size());
    }